

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

SizedPtr google::protobuf::internal::anon_unknown_12::AllocateBlock
                   (AllocationPolicy *policy_ptr,size_t last_size,size_t min_bytes)

{
  size_t sVar1;
  string *psVar2;
  size_t *psVar3;
  void *pvVar4;
  ulong size;
  size_t sVar5;
  SizedPtr SVar6;
  AllocationPolicy policy;
  AllocationPolicy local_58;
  
  local_58.start_block_size = 0x100;
  local_58.max_block_size = 0x8000;
  local_58.block_alloc = (_func_void_ptr_size_t *)0x0;
  local_58.block_dealloc = (_func_void_void_ptr_size_t *)0x0;
  if (policy_ptr != (AllocationPolicy *)0x0) {
    local_58.start_block_size = policy_ptr->start_block_size;
    local_58.max_block_size = policy_ptr->max_block_size;
    local_58.block_alloc = policy_ptr->block_alloc;
    local_58.block_dealloc = policy_ptr->block_dealloc;
  }
  sVar5 = local_58.max_block_size;
  sVar1 = local_58.start_block_size;
  if (min_bytes < 0xfffffffffffffff0) {
    psVar2 = (string *)0x0;
  }
  else {
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (min_bytes,0xffffffffffffffef,
                        "min_bytes <= std::numeric_limits<size_t>::max() - SerialArena::kBlockHeaderSize"
                       );
  }
  if (psVar2 == (string *)0x0) {
    if (last_size * 2 < sVar5) {
      sVar5 = last_size * 2;
    }
    if (last_size == 0) {
      sVar5 = sVar1;
    }
    size = min_bytes + 0x10;
    if (min_bytes + 0x10 < sVar5) {
      size = sVar5;
    }
    SVar6 = AllocateMemory(&local_58,size);
    return SVar6;
  }
  _GLOBAL__N_1::AllocateBlock();
  psVar3 = (size_t *)__tls_get_addr(&PTR_004d49d0);
  pvVar4 = (void *)*psVar3;
  if ((char)pvVar4 == '\0') {
    LOCK();
    UNLOCK();
    pvVar4 = (void *)(ThreadSafeArena::lifecycle_id_ << 8);
    ThreadSafeArena::lifecycle_id_ = ThreadSafeArena::lifecycle_id_ + 1;
  }
  *psVar3 = (long)pvVar4 + 1U;
  SVar6.n = (long)pvVar4 + 1U;
  SVar6.p = pvVar4;
  return SVar6;
}

Assistant:

SizedPtr AllocateBlock(const AllocationPolicy* policy_ptr, size_t last_size,
                       size_t min_bytes) {
  AllocationPolicy policy;  // default policy
  if (policy_ptr) policy = *policy_ptr;
  size_t size =
      AllocationSize(last_size, policy.start_block_size, policy.max_block_size);
  // Verify that min_bytes + kBlockHeaderSize won't overflow.
  ABSL_CHECK_LE(min_bytes, std::numeric_limits<size_t>::max() -
                               SerialArena::kBlockHeaderSize);
  size = std::max(size, SerialArena::kBlockHeaderSize + min_bytes);

  return AllocateMemory(policy, size);
}